

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

bool __thiscall
QFilePrivate::openExternalFile
          (QFilePrivate *this,OpenMode flags,FILE *fh,FileHandleFlags handleFlags)

{
  long lVar1;
  int iVar2;
  pointer this_00;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  long in_FS_OFFSET;
  pointer fe;
  __single_object fs;
  unique_ptr<QFSFileEngine,_std::default_delete<QFSFileEngine>_> *in_stack_ffffffffffffff98;
  unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
  *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<QFSFileEngine>();
  this_00 = std::unique_ptr<QFSFileEngine,_std::default_delete<QFSFileEngine>_>::get
                      ((unique_ptr<QFSFileEngine,_std::default_delete<QFSFileEngine>_> *)
                       in_stack_ffffffffffffffa0);
  std::unique_ptr<QAbstractFileEngine,std::default_delete<QAbstractFileEngine>>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iVar2 = QFSFileEngine::open(this_00,(char *)(ulong)in_ESI,in_EDX,(ulong)in_ECX);
  std::unique_ptr<QFSFileEngine,_std::default_delete<QFSFileEngine>_>::~unique_ptr
            ((unique_ptr<QFSFileEngine,_std::default_delete<QFSFileEngine>_> *)
             in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)((byte)iVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool
QFilePrivate::openExternalFile(QIODevice::OpenMode flags, FILE *fh, QFile::FileHandleFlags handleFlags)
{
#ifdef QT_NO_FSFILEENGINE
    Q_UNUSED(flags);
    Q_UNUSED(fh);
    return false;
#else
    auto fs = std::make_unique<QFSFileEngine>();
    auto fe = fs.get();
    fileEngine = std::move(fs);
    return fe->open(flags, fh, handleFlags);
#endif
}